

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_add_socket_to_epoll(int epoll_fd,int sock,uint32_t events)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint __errnum;
  uint32_t local_1c;
  int local_18;
  undefined4 local_14;
  
  local_14 = 0;
  local_1c = events;
  local_18 = sock;
  iVar1 = epoll_ctl(epoll_fd,1,sock,(epoll_event *)&local_1c);
  __errnum = 0;
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    __stream = _stderr;
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"epoll_ctl(EPOLL_CTL_ADD): %d (%s)",(ulong)__errnum,pcVar3);
  }
  return __errnum;
}

Assistant:

int libj1939_add_socket_to_epoll(int epoll_fd, int sock, uint32_t events)
{
	struct epoll_event ev = {0};
	int ret;

	ev.events = events;
	ev.data.fd = sock;

	ret = epoll_ctl(epoll_fd, EPOLL_CTL_ADD, sock, &ev);
	if (ret < 0) {
		ret = errno;
		pr_err("epoll_ctl(EPOLL_CTL_ADD): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}